

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::Copy
          (TPZSkylMatrix<std::complex<long_double>_> *this,
          TPZSkylMatrix<std::complex<long_double>_> *A)

{
  complex<long_double> **ppcVar1;
  int iVar2;
  int extraout_var;
  complex<long_double> *pcVar4;
  long lVar5;
  long lVar3;
  
  iVar2 = (*(A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(A);
  lVar3 = CONCAT44(extraout_var,iVar2);
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol = lVar3;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow = lVar3;
  TPZVec<std::complex<long_double>_*>::Resize(&this->fElem,(A->fElem).fNElements);
  TPZVec<std::complex<long_double>_>::operator=(&this->fStorage,&A->fStorage);
  pcVar4 = (complex<long_double> *)(this->fStorage).fNElements;
  if (pcVar4 != (complex<long_double> *)0x0) {
    pcVar4 = (this->fStorage).fStore;
  }
  if (-1 < extraout_var) {
    lVar5 = 0;
    do {
      ppcVar1 = (A->fElem).fStore;
      (this->fElem).fStore[lVar5] =
           (complex<long_double> *)(((long)ppcVar1[lVar5] - (long)*ppcVar1) + (long)pcVar4);
      lVar5 = lVar5 + 1;
    } while (lVar3 + 1 != lVar5);
  }
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed =
       (A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDecomposed;
  (this->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDefPositive =
       (A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fDefPositive;
  return;
}

Assistant:

void
TPZSkylMatrix<TVar>::Copy(const TPZSkylMatrix<TVar> &A )
{
    int64_t dimension = A.Dim();
    this->fRow = this->fCol = dimension;
    fElem.Resize(A.fElem.NElements());
    fStorage = A.fStorage;
    int64_t i;
    TVar *firstp = 0;
    if(fStorage.NElements()) firstp = &fStorage[0];
    for(i=0; i<=dimension; i++)
        fElem[i]=firstp+(A.fElem[i]-A.fElem[0]);
    this->fDecomposed  = A.fDecomposed;
    this->fDefPositive = A.fDefPositive;
    
}